

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa_util.cpp
# Opt level: O2

bool spvtools::opt::descsroautil::IsDescriptorStruct(IRContext *context,Instruction *var)

{
  bool bVar1;
  uint32_t id;
  Instruction *this;
  DefUseManager *this_00;
  Operand *this_01;
  
  this = anon_unknown_0::GetVariableType(context,var);
  if (this != (Instruction *)0x0) {
    while (this->opcode_ == OpTypeArray) {
      this_00 = IRContext::get_def_use_mgr(context);
      this_01 = Instruction::GetInOperand(this,0);
      id = Operand::AsId(this_01);
      this = analysis::DefUseManager::GetDef(this_00,id);
    }
    if ((this->opcode_ == OpTypeStruct) && (bVar1 = IsTypeOfStructuredBuffer(context,this), !bVar1))
    {
      bVar1 = anon_unknown_0::HasDescriptorDecorations(context,var);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool IsDescriptorStruct(IRContext* context, Instruction* var) {
  Instruction* var_type_inst = GetVariableType(context, var);
  if (var_type_inst == nullptr) return false;

  while (var_type_inst->opcode() == spv::Op::OpTypeArray) {
    var_type_inst = context->get_def_use_mgr()->GetDef(
        var_type_inst->GetInOperand(0).AsId());
  }

  if (var_type_inst->opcode() != spv::Op::OpTypeStruct) return false;

  // All structures with descriptor assignments must be replaced by variables,
  // one for each of their members - with the exceptions of buffers.
  if (IsTypeOfStructuredBuffer(context, var_type_inst)) {
    return false;
  }

  return HasDescriptorDecorations(context, var);
}